

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O1

void __thiscall libtorrent::dht_stats_alert::~dht_stats_alert(dht_stats_alert *this)

{
  pointer pdVar1;
  pointer pdVar2;
  
  pdVar1 = (this->routing_table).
           super__Vector_base<libtorrent::dht_routing_bucket,_std::allocator<libtorrent::dht_routing_bucket>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1,(long)(this->routing_table).
                                 super__Vector_base<libtorrent::dht_routing_bucket,_std::allocator<libtorrent::dht_routing_bucket>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pdVar1);
  }
  pdVar2 = (this->active_requests).
           super__Vector_base<libtorrent::dht_lookup,_std::allocator<libtorrent::dht_lookup>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2,(long)(this->active_requests).
                                 super__Vector_base<libtorrent::dht_lookup,_std::allocator<libtorrent::dht_lookup>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pdVar2);
  }
  operator_delete(this,0x40);
  return;
}

Assistant:

struct TORRENT_EXPORT dht_stats_alert final : alert
	{
		// internal
		dht_stats_alert(aux::stack_allocator& alloc
			, std::vector<dht_routing_bucket> table
			, std::vector<dht_lookup> requests);

		TORRENT_DEFINE_ALERT(dht_stats_alert, 83)

		static constexpr alert_category_t static_category = alert_category::stats;
		std::string message() const override;

		// a vector of the currently running DHT lookups.
		std::vector<dht_lookup> active_requests;

		// contains information about every bucket in the DHT routing
		// table.
		std::vector<dht_routing_bucket> routing_table;
	}